

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::del(QWidgetLineControl *this)

{
  bool bVar1;
  int iVar2;
  QTextLayout *pQVar3;
  int iVar4;
  QWidgetLineControl *in_RDI;
  int n;
  int priorState;
  bool in_stack_0000002f;
  QWidgetLineControl *in_stack_00000030;
  QWidgetLineControl *in_stack_00000040;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = hasSelectedText((QWidgetLineControl *)
                          CONCAT44(*(undefined4 *)(in_RDI + 0xf4),in_stack_fffffffffffffff0));
  if (bVar1) {
    removeSelectedText(in_stack_00000040);
  }
  else {
    pQVar3 = textLayout(in_RDI);
    iVar2 = QTextLayout::nextCursorPosition((int)pQVar3,*(CursorMode *)(in_RDI + 0x40));
    iVar2 = iVar2 - *(int *)(in_RDI + 0x40);
    while (iVar4 = iVar2 + -1, iVar2 != 0) {
      internalDelete(in_stack_00000030,in_stack_0000002f);
      iVar2 = iVar4;
    }
  }
  finishChange(this,priorState,n._3_1_,n._2_1_);
  return;
}

Assistant:

void QWidgetLineControl::del()
{
    int priorState = m_undoState;
    if (hasSelectedText()) {
        removeSelectedText();
    } else {
        int n = textLayout()->nextCursorPosition(m_cursor) - m_cursor;
        while (n--)
            internalDelete();
    }
    finishChange(priorState);
}